

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_enum.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::EnumGenerator::Generate(EnumGenerator *this,Printer *printer)

{
  ushort *puVar1;
  string *psVar2;
  string_view v;
  Options *pOVar3;
  EnumDescriptor *pEVar4;
  LogMessage *pLVar5;
  Nonnull<char_*> pcVar6;
  Nonnull<const_char_*> pcVar7;
  long lVar8;
  csharp *this_00;
  char *pcVar9;
  ulong v1;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view v_00;
  string_view str_02;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view enum_value_name;
  string_view enum_name;
  int number;
  undefined1 local_f8 [32];
  HeapOrSoo local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8 [2];
  string name;
  string_view original_name;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  used_names;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  local_50;
  
  pOVar3 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
  WriteEnumDocComment(printer,pOVar3,this->descriptor_);
  if ((this->descriptor_->options_->field_0)._impl_.deprecated_ == true) {
    text._M_str = "[global::System.ObsoleteAttribute]\n";
    text._M_len = 0x23;
    io::Printer::Print<>(printer,text);
  }
  SourceGeneratorBase::class_access_level_abi_cxx11_
            ((string *)&local_d8.heap,&this->super_SourceGeneratorBase);
  puVar1 = (ushort *)(this->descriptor_->all_names_).payload_;
  used_names.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       (size_t)*puVar1;
  used_names.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
       (long)puVar1 +
       ~used_names.
        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .settings_.
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
        capacity_;
  pcVar9 = "name";
  text_00._M_str = "$access_level$ enum $name$ {\n";
  text_00._M_len = 0x1d;
  io::Printer::
  Print<char[13],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>>
            (printer,text_00,(char (*) [13])"access_level",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8.heap,
             (char (*) [5])0x6fff3e,(basic_string_view<char,_std::char_traits<char>_> *)&used_names)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.heap.control != local_c8) {
    operator_delete(local_d8.heap.control,
                    CONCAT71(local_c8[0]._M_allocated_capacity._1_7_,local_c8[0]._M_local_buf[0]) +
                    1);
  }
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  used_names.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  used_names.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  used_names.
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  local_50.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  local_50.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  if (0 < this->descriptor_->value_count_) {
    v1 = 0;
    do {
      pOVar3 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
      lVar8 = (long)this->descriptor_->value_count_;
      if (lVar8 <= (long)v1) {
        pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (v1 & 0xffffffff,lVar8,"index < value_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_d8.heap,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xabb,pcVar7);
LAB_0029571f:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_d8.heap);
      }
      WriteEnumValueDocComment(printer,pOVar3,this->descriptor_->values_ + v1);
      pEVar4 = this->descriptor_;
      lVar8 = (long)pEVar4->value_count_;
      if (lVar8 <= (long)v1) {
        pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (v1,lVar8,"index < value_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_d8.heap,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xabb,pcVar7);
        goto LAB_0029571f;
      }
      if (((pEVar4->values_[v1].options_)->field_0)._impl_.deprecated_ == true) {
        text_01._M_str = "[global::System.ObsoleteAttribute]\n";
        text_01._M_len = 0x23;
        io::Printer::Print<>(printer,text_01);
        pEVar4 = this->descriptor_;
        lVar8 = (long)pEVar4->value_count_;
      }
      if (lVar8 <= (long)v1) {
        pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (v1,lVar8,"index < value_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_d8.heap,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xabb,pcVar7);
        goto LAB_0029571f;
      }
      psVar2 = pEVar4->values_[v1].all_names_;
      original_name._M_str = (psVar2->_M_dataplus)._M_p;
      original_name._M_len = psVar2->_M_string_length;
      if ((long)pEVar4->value_count_ <= (long)v1) {
        pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (v1,(long)pEVar4->value_count_,"index < value_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_d8.heap,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xabb,pcVar7);
        goto LAB_0029571f;
      }
      puVar1 = (ushort *)(pEVar4->all_names_).payload_;
      this_00 = (csharp *)(ulong)*puVar1;
      enum_name._M_len = (long)puVar1 + ~(ulong)this_00;
      psVar2 = pEVar4->values_[v1].all_names_;
      enum_value_name._M_str = pcVar9;
      enum_value_name._M_len = (size_t)(psVar2->_M_dataplus)._M_p;
      enum_name._M_str = (char *)psVar2->_M_string_length;
      GetEnumValueName_abi_cxx11_(&name,this_00,enum_name,enum_value_name);
      while( true ) {
        local_f8._0_8_ = &used_names;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
        ::EmplaceDecomposable::operator()
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
                    *)&local_d8.heap,local_f8,&name,&name);
        if (local_c8[0]._M_local_buf[0] != '\0') break;
        absl::lts_20250127::log_internal::LogMessage::LogMessage
                  ((LogMessage *)&local_d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/csharp/csharp_enum.cc"
                   ,0x3c);
        str._M_str = "Duplicate enum value ";
        str._M_len = 0x15;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  ((LogMessage *)&local_d8.heap,str);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           ((LogMessage *)&local_d8.heap,&name);
        str_00._M_str = " (originally ";
        str_00._M_len = 0xd;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (pLVar5,str_00);
        v._M_str = original_name._M_str;
        v._M_len = original_name._M_len;
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,v);
        str_01._M_str = ") in ";
        str_01._M_len = 5;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (pLVar5,str_01);
        puVar1 = (ushort *)(this->descriptor_->all_names_).payload_;
        v_00._M_len = (ulong)*puVar1;
        v_00._M_str = (char *)((long)puVar1 + ~v_00._M_len);
        pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,v_00);
        str_02._M_str = "; adding underscore to distinguish";
        str_02._M_len = 0x22;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (pLVar5,str_02);
        absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_d8.heap);
        local_d8.heap.control = (ctrl_t *)0x1;
        local_d8.heap.slot_array = (MaybeInitializedPtr)((long)"\'_" + 1);
        absl::lts_20250127::StrAppend(&name,(AlphaNum *)&local_d8.heap);
      }
      lVar8 = (long)this->descriptor_->value_count_;
      if (lVar8 <= (long)v1) {
        pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (v1,lVar8,"index < value_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_d8.heap,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xabb,pcVar7);
        goto LAB_0029571f;
      }
      number = this->descriptor_->values_[v1].number_;
      local_f8._0_8_ = &local_50;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<int>>
      ::EmplaceDecomposable::operator()
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>::iterator,_bool>
                  *)&local_d8.heap,local_f8,&number,&number);
      if (local_c8[0]._M_local_buf[0] == '\0') {
        pcVar6 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                           (number,local_c8[0]._M_local_buf);
        local_d8.heap.control = pcVar6 + -(long)local_c8;
        local_f8._0_8_ = local_f8 + 0x10;
        local_d8.heap.slot_array = (MaybeInitializedPtr)local_c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,local_c8,pcVar6);
        pcVar9 = "name";
        text_03._M_str =
             "[pbr::OriginalName(\"$original_name$\", PreferredAlias = false)] $name$ = $number$,\n"
        ;
        text_03._M_len = 0x52;
        io::Printer::
        Print<char[14],std::basic_string_view<char,std::char_traits<char>>,char[5],std::__cxx11::string,char[7],std::__cxx11::string>
                  (printer,text_03,(char (*) [14])"original_name",&original_name,
                   (char (*) [5])0x6fff3e,&name,(char (*) [7])0x6ca8c3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
      }
      else {
        pcVar6 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                           (number,local_c8[0]._M_local_buf);
        local_d8.heap.control = pcVar6 + -(long)local_c8;
        local_f8._0_8_ = local_f8 + 0x10;
        local_d8.heap.slot_array = (MaybeInitializedPtr)local_c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,local_c8,pcVar6);
        pcVar9 = "name";
        text_02._M_str = "[pbr::OriginalName(\"$original_name$\")] $name$ = $number$,\n";
        text_02._M_len = 0x3a;
        io::Printer::
        Print<char[14],std::basic_string_view<char,std::char_traits<char>>,char[5],std::__cxx11::string,char[7],std::__cxx11::string>
                  (printer,text_02,(char (*) [14])"original_name",&original_name,
                   (char (*) [5])0x6fff3e,&name,(char (*) [7])0x6ca8c3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
      }
      if ((flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_f8._0_8_ !=
          (flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      v1 = v1 + 1;
    } while ((long)v1 < (long)this->descriptor_->value_count_);
  }
  io::Printer::Outdent(printer);
  text_04._M_str = "}\n";
  text_04._M_len = 2;
  io::Printer::Print<>(printer,text_04);
  text_05._M_str = "\n";
  text_05._M_len = 1;
  io::Printer::Print<>(printer,text_05);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<int>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
  ::destructor_impl(&local_50);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set(&used_names.
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
  return;
}

Assistant:

void EnumGenerator::Generate(io::Printer* printer) {
  WriteEnumDocComment(printer, options(), descriptor_);
  if (descriptor_->options().deprecated()) {
    printer->Print("[global::System.ObsoleteAttribute]\n");
  }
  printer->Print("$access_level$ enum $name$ {\n",
                 "access_level", class_access_level(),
                 "name", descriptor_->name());
  printer->Indent();
  absl::flat_hash_set<std::string> used_names;
  absl::flat_hash_set<int> used_number;
  for (int i = 0; i < descriptor_->value_count(); i++) {
    WriteEnumValueDocComment(printer, options(), descriptor_->value(i));
    if (descriptor_->value(i)->options().deprecated()) {
      printer->Print("[global::System.ObsoleteAttribute]\n");
    }
    const absl::string_view original_name = descriptor_->value(i)->name();
    std::string name =
        GetEnumValueName(descriptor_->name(), descriptor_->value(i)->name());
    // Make sure we don't get any duplicate names due to prefix removal.
    while (!used_names.insert(name).second) {
      // It's possible we'll end up giving this warning multiple times, but
      // that's better than not at all.
      ABSL_LOG(WARNING) << "Duplicate enum value " << name << " (originally "
                        << original_name << ") in " << descriptor_->name()
                        << "; adding underscore to distinguish";
      absl::StrAppend(&name, "_");
    }
    int number = descriptor_->value(i)->number();
    if (!used_number.insert(number).second) {
      printer->Print(
          "[pbr::OriginalName(\"$original_name$\", PreferredAlias = false)] "
          "$name$ = $number$,\n",
          "original_name", original_name, "name", name, "number",
          absl::StrCat(number));
    } else {
      printer->Print(
          "[pbr::OriginalName(\"$original_name$\")] $name$ = $number$,\n",
          "original_name", original_name, "name", name, "number",
          absl::StrCat(number));
    }
  }
  printer->Outdent();
  printer->Print("}\n");
  printer->Print("\n");
}